

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# attached_database.cpp
# Opt level: O2

void __thiscall
duckdb::AttachedDatabase::AttachedDatabase
          (AttachedDatabase *this,DatabaseInstance *db,Catalog *catalog_p,
          StorageExtension *storage_extension_p,ClientContext *context,string *name_p,
          AttachInfo *info,AttachOptions *options)

{
  optional_ptr<duckdb::StorageExtension,_true> *this_00;
  undefined8 uVar1;
  code *pcVar2;
  _Head_base<0UL,_duckdb::Catalog_*,_false> _Var3;
  __uniq_ptr_data<duckdb::StorageManager,_std::default_delete<duckdb::StorageManager>,_true,_true>
  _Var4;
  _Head_base<0UL,_duckdb::TransactionManager_*,_false> _Var5;
  _Alloc_hider _Var6;
  unique_ptr<duckdb::TransactionManager,_std::default_delete<duckdb::TransactionManager>,_true>
  *puVar7;
  int iVar8;
  StorageExtension *pSVar9;
  type pAVar10;
  pointer pCVar11;
  type pCVar12;
  _Head_base<0UL,_duckdb::StorageManager_*,_false> _Var13;
  InternalException *pIVar14;
  bool read_only;
  undefined7 uStack_97;
  unique_ptr<duckdb::Catalog,_std::default_delete<duckdb::Catalog>,_true> *local_90;
  string local_88;
  _Alloc_hider local_68;
  unique_ptr<duckdb::TransactionManager,_std::default_delete<duckdb::TransactionManager>,_true>
  *local_60;
  undefined1 local_58 [8];
  string local_50;
  
  local_58 = (undefined1  [8])context;
  ::std::__cxx11::string::string((string *)(local_58 + 8),(string *)name_p);
  CatalogEntry::CatalogEntry
            (&this->super_CatalogEntry,DATABASE_ENTRY,catalog_p,(string *)(local_58 + 8));
  ::std::__cxx11::string::~string((string *)(local_58 + 8));
  (this->super_CatalogEntry)._vptr_CatalogEntry = (_func_int **)&PTR__AttachedDatabase_027bb1c8;
  this->db = db;
  local_68._M_p = (pointer)&this->storage;
  local_90 = &this->catalog;
  local_60 = &this->transaction_manager;
  (this->transaction_manager).
  super_unique_ptr<duckdb::TransactionManager,_std::default_delete<duckdb::TransactionManager>_>.
  _M_t.
  super___uniq_ptr_impl<duckdb::TransactionManager,_std::default_delete<duckdb::TransactionManager>_>
  ._M_t.
  super__Tuple_impl<0UL,_duckdb::TransactionManager_*,_std::default_delete<duckdb::TransactionManager>_>
  .super__Head_base<0UL,_duckdb::TransactionManager_*,_false>._M_head_impl =
       (TransactionManager *)0x0;
  (this->storage).
  super_unique_ptr<duckdb::StorageManager,_std::default_delete<duckdb::StorageManager>_>._M_t.
  super___uniq_ptr_impl<duckdb::StorageManager,_std::default_delete<duckdb::StorageManager>_>._M_t.
  super__Tuple_impl<0UL,_duckdb::StorageManager_*,_std::default_delete<duckdb::StorageManager>_>.
  super__Head_base<0UL,_duckdb::StorageManager_*,_false>._M_head_impl = (StorageManager *)0x0;
  (this->catalog).super_unique_ptr<duckdb::Catalog,_std::default_delete<duckdb::Catalog>_>._M_t.
  super___uniq_ptr_impl<duckdb::Catalog,_std::default_delete<duckdb::Catalog>_>._M_t.
  super__Tuple_impl<0UL,_duckdb::Catalog_*,_std::default_delete<duckdb::Catalog>_>.
  super__Head_base<0UL,_duckdb::Catalog_*,_false>._M_head_impl = (Catalog *)0x0;
  (this->parent_catalog).ptr = catalog_p;
  this_00 = &this->storage_extension;
  (this->storage_extension).ptr = storage_extension_p;
  this->is_initial_database = false;
  this->is_closed = false;
  this->type = (uint)(options->access_mode == READ_ONLY);
  pSVar9 = optional_ptr<duckdb::StorageExtension,_true>::operator->(this_00);
  uVar1 = *(undefined8 *)(pSVar9 + 0x18);
  pSVar9 = optional_ptr<duckdb::StorageExtension,_true>::operator->(this_00);
  pcVar2 = *(code **)(pSVar9 + 8);
  AttachInfo::Copy((AttachInfo *)&read_only);
  pAVar10 = unique_ptr<duckdb::AttachInfo,_std::default_delete<duckdb::AttachInfo>,_true>::operator*
                      ((unique_ptr<duckdb::AttachInfo,_std::default_delete<duckdb::AttachInfo>,_true>
                        *)&read_only);
  (*pcVar2)(&local_88,uVar1,local_58,this,&(this->super_CatalogEntry).name,pAVar10,
            options->access_mode);
  _Var6._M_p = local_88._M_dataplus._M_p;
  local_88._M_dataplus._M_p = (pointer)0x0;
  _Var3._M_head_impl =
       (local_90->super_unique_ptr<duckdb::Catalog,_std::default_delete<duckdb::Catalog>_>)._M_t.
       super___uniq_ptr_impl<duckdb::Catalog,_std::default_delete<duckdb::Catalog>_>._M_t.
       super__Tuple_impl<0UL,_duckdb::Catalog_*,_std::default_delete<duckdb::Catalog>_>.
       super__Head_base<0UL,_duckdb::Catalog_*,_false>._M_head_impl;
  (local_90->super_unique_ptr<duckdb::Catalog,_std::default_delete<duckdb::Catalog>_>)._M_t.
  super___uniq_ptr_impl<duckdb::Catalog,_std::default_delete<duckdb::Catalog>_>._M_t.
  super__Tuple_impl<0UL,_duckdb::Catalog_*,_std::default_delete<duckdb::Catalog>_>.
  super__Head_base<0UL,_duckdb::Catalog_*,_false>._M_head_impl = (Catalog *)_Var6._M_p;
  if (_Var3._M_head_impl != (Catalog *)0x0) {
    (**(code **)((long)(_Var3._M_head_impl)->_vptr_Catalog + 8))();
    if ((long *)local_88._M_dataplus._M_p != (long *)0x0) {
      (**(code **)(*(long *)local_88._M_dataplus._M_p + 8))();
    }
  }
  local_88._M_dataplus._M_p = (pointer)0x0;
  if ((long *)CONCAT71(uStack_97,read_only) != (long *)0x0) {
    (**(code **)(*(long *)CONCAT71(uStack_97,read_only) + 8))();
  }
  if ((local_90->super_unique_ptr<duckdb::Catalog,_std::default_delete<duckdb::Catalog>_>)._M_t.
      super___uniq_ptr_impl<duckdb::Catalog,_std::default_delete<duckdb::Catalog>_>._M_t.
      super__Tuple_impl<0UL,_duckdb::Catalog_*,_std::default_delete<duckdb::Catalog>_>.
      super__Head_base<0UL,_duckdb::Catalog_*,_false>._M_head_impl != (Catalog *)0x0) {
    pCVar11 = unique_ptr<duckdb::Catalog,_std::default_delete<duckdb::Catalog>,_true>::operator->
                        (local_90);
    iVar8 = (*pCVar11->_vptr_Catalog[2])(pCVar11);
    puVar7 = local_60;
    if ((char)iVar8 != '\0') {
      read_only = options->access_mode == READ_ONLY;
      make_uniq<duckdb::SingleFileStorageManager,duckdb::AttachedDatabase&,std::__cxx11::string_const&,bool&>
                ((duckdb *)&local_88,this,&info->path,&read_only);
      _Var6._M_p = local_88._M_dataplus._M_p;
      local_88._M_dataplus._M_p = (pointer)0x0;
      _Var4.
      super___uniq_ptr_impl<duckdb::StorageManager,_std::default_delete<duckdb::StorageManager>_>.
      _M_t.
      super__Tuple_impl<0UL,_duckdb::StorageManager_*,_std::default_delete<duckdb::StorageManager>_>
      .super__Head_base<0UL,_duckdb::StorageManager_*,_false>._M_head_impl =
           *(__uniq_ptr_impl<duckdb::StorageManager,_std::default_delete<duckdb::StorageManager>_> *
            )local_68._M_p;
      *(pointer *)local_68._M_p = _Var6._M_p;
      if (_Var4.
          super___uniq_ptr_impl<duckdb::StorageManager,_std::default_delete<duckdb::StorageManager>_>
          ._M_t.
          super__Tuple_impl<0UL,_duckdb::StorageManager_*,_std::default_delete<duckdb::StorageManager>_>
          .super__Head_base<0UL,_duckdb::StorageManager_*,_false>._M_head_impl !=
          (tuple<duckdb::StorageManager_*,_std::default_delete<duckdb::StorageManager>_>)0x0) {
        (**(code **)(*(long *)_Var4.
                              super___uniq_ptr_impl<duckdb::StorageManager,_std::default_delete<duckdb::StorageManager>_>
                              ._M_t.
                              super__Tuple_impl<0UL,_duckdb::StorageManager_*,_std::default_delete<duckdb::StorageManager>_>
                              .super__Head_base<0UL,_duckdb::StorageManager_*,_false>._M_head_impl +
                    8))();
        if ((StorageManager *)local_88._M_dataplus._M_p != (StorageManager *)0x0) {
          (*(*(_func_int ***)local_88._M_dataplus._M_p)[1])();
        }
      }
    }
    pSVar9 = optional_ptr<duckdb::StorageExtension,_true>::operator->(this_00);
    pcVar2 = *(code **)(pSVar9 + 0x10);
    pCVar12 = unique_ptr<duckdb::Catalog,_std::default_delete<duckdb::Catalog>,_true>::operator*
                        (local_90);
    (*pcVar2)(&local_88,uVar1,this,pCVar12);
    _Var13._M_head_impl = (StorageManager *)local_88._M_dataplus;
    local_88._M_dataplus._M_p = (pointer)0x0;
    _Var5._M_head_impl =
         (puVar7->
         super_unique_ptr<duckdb::TransactionManager,_std::default_delete<duckdb::TransactionManager>_>
         )._M_t.
         super___uniq_ptr_impl<duckdb::TransactionManager,_std::default_delete<duckdb::TransactionManager>_>
         ._M_t.
         super__Tuple_impl<0UL,_duckdb::TransactionManager_*,_std::default_delete<duckdb::TransactionManager>_>
         .super__Head_base<0UL,_duckdb::TransactionManager_*,_false>._M_head_impl;
    (puVar7->
    super_unique_ptr<duckdb::TransactionManager,_std::default_delete<duckdb::TransactionManager>_>).
    _M_t.
    super___uniq_ptr_impl<duckdb::TransactionManager,_std::default_delete<duckdb::TransactionManager>_>
    ._M_t.
    super__Tuple_impl<0UL,_duckdb::TransactionManager_*,_std::default_delete<duckdb::TransactionManager>_>
    .super__Head_base<0UL,_duckdb::TransactionManager_*,_false>._M_head_impl =
         (TransactionManager *)_Var13._M_head_impl;
    if (_Var5._M_head_impl != (TransactionManager *)0x0) {
      (**(code **)((long)(_Var5._M_head_impl)->_vptr_TransactionManager + 8))();
      if ((long *)local_88._M_dataplus._M_p != (long *)0x0) {
        (**(code **)(*(long *)local_88._M_dataplus._M_p + 8))();
      }
      _Var13._M_head_impl =
           (StorageManager *)
           (puVar7->
           super_unique_ptr<duckdb::TransactionManager,_std::default_delete<duckdb::TransactionManager>_>
           )._M_t.
           super___uniq_ptr_impl<duckdb::TransactionManager,_std::default_delete<duckdb::TransactionManager>_>
           ._M_t.
           super__Tuple_impl<0UL,_duckdb::TransactionManager_*,_std::default_delete<duckdb::TransactionManager>_>
           .super__Head_base<0UL,_duckdb::TransactionManager_*,_false>._M_head_impl;
    }
    if (_Var13._M_head_impl != (StorageManager *)0x0) {
      (this->super_CatalogEntry).internal = true;
      return;
    }
    pIVar14 = (InternalException *)__cxa_allocate_exception(0x10);
    ::std::__cxx11::string::string
              ((string *)&local_88,
               "AttachedDatabase - create_transaction_manager function did not return a transaction manager"
               ,(allocator *)&read_only);
    InternalException::InternalException(pIVar14,&local_88);
    __cxa_throw(pIVar14,&InternalException::typeinfo,::std::runtime_error::~runtime_error);
  }
  pIVar14 = (InternalException *)__cxa_allocate_exception(0x10);
  ::std::__cxx11::string::string
            ((string *)&local_88,"AttachedDatabase - attach function did not return a catalog",
             (allocator *)&read_only);
  InternalException::InternalException(pIVar14,&local_88);
  __cxa_throw(pIVar14,&InternalException::typeinfo,::std::runtime_error::~runtime_error);
}

Assistant:

AttachedDatabase::AttachedDatabase(DatabaseInstance &db, Catalog &catalog_p, StorageExtension &storage_extension_p,
                                   ClientContext &context, string name_p, const AttachInfo &info,
                                   const AttachOptions &options)
    : CatalogEntry(CatalogType::DATABASE_ENTRY, catalog_p, std::move(name_p)), db(db), parent_catalog(&catalog_p),
      storage_extension(&storage_extension_p) {

	if (options.access_mode == AccessMode::READ_ONLY) {
		type = AttachedDatabaseType::READ_ONLY_DATABASE;
	} else {
		type = AttachedDatabaseType::READ_WRITE_DATABASE;
	}

	StorageExtensionInfo *storage_info = storage_extension->storage_info.get();
	catalog = storage_extension->attach(storage_info, context, *this, name, *info.Copy(), options.access_mode);
	if (!catalog) {
		throw InternalException("AttachedDatabase - attach function did not return a catalog");
	}
	if (catalog->IsDuckCatalog()) {
		// The attached database uses the DuckCatalog.
		auto read_only = options.access_mode == AccessMode::READ_ONLY;
		storage = make_uniq<SingleFileStorageManager>(*this, info.path, read_only);
	}
	transaction_manager = storage_extension->create_transaction_manager(storage_info, *this, *catalog);
	if (!transaction_manager) {
		throw InternalException(
		    "AttachedDatabase - create_transaction_manager function did not return a transaction manager");
	}
	internal = true;
}